

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

int __thiscall google::protobuf::internal::ExtensionSet::NumExtensions(ExtensionSet *this)

{
  uint16_t uVar1;
  LargeMap *pLVar2;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  int iVar5;
  _Rb_tree_header *p_Var6;
  
  uVar1 = this->flat_size_;
  pLVar2 = (this->map_).large;
  if ((long)(short)uVar1 < 0) {
    p_Var3 = (pLVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(pLVar2->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var6) {
      iVar5 = 0;
      do {
        iVar5 = iVar5 + (~(uint)*(byte *)((long)&p_Var3[1]._M_left + 2) & 1);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var6);
      return iVar5;
    }
  }
  else if (uVar1 != 0) {
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (~(uint)*(byte *)((long)&(pLVar2->_M_t)._M_impl.super__Rb_tree_header.
                                               _M_header._M_parent + lVar4 + 2) & 1);
      lVar4 = lVar4 + 0x20;
    } while ((long)(short)uVar1 * 0x20 != lVar4);
    return iVar5;
  }
  return 0;
}

Assistant:

int ExtensionSet::NumExtensions() const {
  int result = 0;
  ForEach([&result](int /* number */, const Extension& ext) {
    if (!ext.is_cleared) {
      ++result;
    }
  });
  return result;
}